

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O1

xmlSchemaTypePtr xmlSchemaInitBasicType(char *name,xmlSchemaValType type,xmlSchemaTypePtr baseType)

{
  byte *pbVar1;
  ulong uVar2;
  xmlSchemaTypePtr __s;
  xmlSchemaFacetPtr pxVar3;
  xmlSchemaValPtr pxVar4;
  uint uVar5;
  
  uVar2 = (ulong)type;
  __s = (xmlSchemaTypePtr)(*xmlMalloc)(0xe0);
  if (__s == (xmlSchemaTypePtr)0x0) {
    __xmlSimpleError(0xf,2,(xmlNodePtr)0x0,(char *)0x0,"could not initialize basic types");
    return (xmlSchemaTypePtr)0x0;
  }
  memset(__s,0,0xe0);
  __s->name = (xmlChar *)name;
  __s->targetNamespace = (xmlChar *)"http://www.w3.org/2001/XMLSchema";
  __s->type = XML_SCHEMA_TYPE_BASIC;
  __s->baseType = baseType;
  __s->contentType = XML_SCHEMA_CONTENT_BASIC;
  if ((type < (XML_SCHEMAS_ANYSIMPLETYPE|XML_SCHEMAS_STRING)) &&
     (((0x18003020fffaU >> (uVar2 & 0x3f) & 1) == 0 ||
      (pbVar1 = (byte *)((long)&__s->flags + 1), *pbVar1 = *pbVar1 | 0x40,
      type < (XML_SCHEMAS_ANYSIMPLETYPE|XML_SCHEMAS_STRING))))) {
    if ((0xa080000UL >> (uVar2 & 0x3f) & 1) == 0) {
      if ((0x600000000000U >> (uVar2 & 0x3f) & 1) != 0) goto LAB_001d0b13;
      goto LAB_001d0acf;
    }
    *(byte *)&__s->flags = (byte)__s->flags | 0x40;
    pxVar3 = xmlSchemaNewFacet();
    if (pxVar3 == (xmlSchemaFacetPtr)0x0) {
LAB_001d0afe:
      pxVar3 = (xmlSchemaFacetPtr)0x0;
    }
    else {
      pxVar3->type = XML_SCHEMA_FACET_MINLENGTH;
      pxVar4 = (xmlSchemaValPtr)(*xmlMalloc)(0x30);
      if (pxVar4 == (xmlSchemaValPtr)0x0) {
        pxVar4 = (xmlSchemaValPtr)0x0;
      }
      else {
        *(undefined8 *)pxVar4 = 0;
        pxVar4->next = (_xmlSchemaVal *)0x0;
        (pxVar4->value).decimal.hi = 0;
        *(undefined8 *)((long)&pxVar4->value + 0x18) = 0;
        (pxVar4->value).decimal.lo = 0;
        (pxVar4->value).decimal.mi = 0;
        pxVar4->type = XML_SCHEMAS_NNINTEGER;
      }
      pxVar3->val = pxVar4;
      if (pxVar4 == (xmlSchemaValPtr)0x0) {
        (*xmlFree)(pxVar3);
        goto LAB_001d0afe;
      }
      (pxVar4->value).decimal.lo = 1;
    }
    __s->facets = pxVar3;
    uVar5 = 0x8000000;
  }
  else {
LAB_001d0acf:
    uVar5 = 0x100;
  }
  __s->flags = __s->flags | uVar5;
LAB_001d0b13:
  xmlHashAddEntry2(xmlSchemaTypesBank,__s->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema",__s);
  __s->builtInType = type;
  return __s;
}

Assistant:

static xmlSchemaTypePtr
xmlSchemaInitBasicType(const char *name, xmlSchemaValType type,
		       xmlSchemaTypePtr baseType) {
    xmlSchemaTypePtr ret;

    ret = (xmlSchemaTypePtr) xmlMalloc(sizeof(xmlSchemaType));
    if (ret == NULL) {
        xmlSchemaTypeErrMemory(NULL, "could not initialize basic types");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaType));
    ret->name = (const xmlChar *)name;
    ret->targetNamespace = XML_SCHEMAS_NAMESPACE_NAME;
    ret->type = XML_SCHEMA_TYPE_BASIC;
    ret->baseType = baseType;
    ret->contentType = XML_SCHEMA_CONTENT_BASIC;
    /*
    * Primitive types.
    */
    switch (type) {
	case XML_SCHEMAS_STRING:
	case XML_SCHEMAS_DECIMAL:
	case XML_SCHEMAS_DATE:
	case XML_SCHEMAS_DATETIME:
	case XML_SCHEMAS_TIME:
	case XML_SCHEMAS_GYEAR:
	case XML_SCHEMAS_GYEARMONTH:
	case XML_SCHEMAS_GMONTH:
	case XML_SCHEMAS_GMONTHDAY:
	case XML_SCHEMAS_GDAY:
	case XML_SCHEMAS_DURATION:
	case XML_SCHEMAS_FLOAT:
	case XML_SCHEMAS_DOUBLE:
	case XML_SCHEMAS_BOOLEAN:
	case XML_SCHEMAS_ANYURI:
	case XML_SCHEMAS_HEXBINARY:
	case XML_SCHEMAS_BASE64BINARY:
	case XML_SCHEMAS_QNAME:
	case XML_SCHEMAS_NOTATION:
	    ret->flags |= XML_SCHEMAS_TYPE_BUILTIN_PRIMITIVE;
	    break;
	default:
	    break;
    }
    /*
    * Set variety.
    */
    switch (type) {
	case XML_SCHEMAS_ANYTYPE:
	case XML_SCHEMAS_ANYSIMPLETYPE:
	    break;
	case XML_SCHEMAS_IDREFS:
	case XML_SCHEMAS_NMTOKENS:
	case XML_SCHEMAS_ENTITIES:
	    ret->flags |= XML_SCHEMAS_TYPE_VARIETY_LIST;
	    ret->facets = xmlSchemaNewMinLengthFacet(1);
	    ret->flags |= XML_SCHEMAS_TYPE_HAS_FACETS;
	    break;
	default:
	    ret->flags |= XML_SCHEMAS_TYPE_VARIETY_ATOMIC;
	    break;
    }
    xmlHashAddEntry2(xmlSchemaTypesBank, ret->name,
	             XML_SCHEMAS_NAMESPACE_NAME, ret);
    ret->builtInType = type;
    return(ret);
}